

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O2

void __thiscall CGrid::Print(CGrid *this,FILE *pFile,int iMode)

{
  char cVar1;
  short sVar2;
  short sVar3;
  pointer ppCVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  CLayer *pCVar10;
  char *pcVar11;
  pointer ppCVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  if (pFile == (FILE *)0x0) {
    return;
  }
  if (iMode == 0) {
    fprintf((FILE *)pFile,"grid(%d,%d,%d) 0x%x\n",
            (ulong)(uint)(int)(this->super_CBoundary).super_CPoint.m_iX,
            (ulong)(uint)(int)(this->super_CBoundary).super_CPoint.m_iY,
            (ulong)(uint)(int)(this->super_CBoundary).super_CPoint.m_cZ,this);
    sVar2 = (this->super_CBoundary).super_CPoint.m_iX;
    sVar3 = (this->super_CBoundary).super_CPoint.m_iY;
    cVar1 = (this->super_CBoundary).super_CPoint.m_cZ;
    uVar6 = CBoundary::GetCapacity(&this->super_CBoundary,0x2000);
    uVar7 = CBoundary::GetCapacity(&this->super_CBoundary,0x1000);
    pCVar10 = GetParent(this);
    uVar8 = CLayer::GetCapacity(pCVar10,0x40);
    uVar9 = CBoundary::GetOverFlow(&this->super_CBoundary);
    fprintf((FILE *)pFile,"bnd(%d,%d,%d): ocu_cap:%d\tavb_cap:%d\tmax_cap:%d\toverflow:%d\n",
            (ulong)(uint)(int)sVar2,(int)sVar3,(ulong)(uint)(int)cVar1,(ulong)uVar6,(ulong)uVar7,
            (ulong)uVar8,(ulong)uVar9);
    ppCVar4 = (this->super_CBoundary).m_Wire.super__Vector_base<CWire_*,_std::allocator<CWire_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar12 = (this->super_CBoundary).m_Wire.
                    super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppCVar12 != ppCVar4; ppCVar12 = ppCVar12 + 1)
    {
      (*((*ppCVar12)->super_CObject)._vptr_CObject[2])(*ppCVar12,pFile,0);
    }
  }
  else if (iMode == 1) {
    dVar13 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX;
    dVar14 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY + -0.5;
    fprintf((FILE *)pFile,"plot([%.1f,%.1f],[%.1f,%.1f],\'%s\');\n",dVar13 + -0.5,dVar13 + 0.5,
            dVar14,dVar14,"-r");
    dVar13 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX + -0.5;
    dVar14 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY;
    fprintf((FILE *)pFile,"plot([%.2f,%.2f],[%.2f,%.2f],\'%s\');\n",dVar13,dVar13,dVar14 + -0.5,
            dVar14 + 0.5,"-r");
  }
  else if (iMode == 0x80) {
    dVar13 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX;
    dVar14 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY + -0.5;
    uVar6 = (uint)(this->super_CBoundary).super_CPoint.m_cZ;
    fprintf((FILE *)pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],\'%s\');\n",dVar13 + -0.5,
            dVar13 + 0.5,dVar14,dVar14,(ulong)uVar6,(ulong)uVar6,"-r");
    dVar13 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX + -0.5;
    dVar14 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY;
    uVar6 = (uint)(this->super_CBoundary).super_CPoint.m_cZ;
    fprintf((FILE *)pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],\'%s\');\n",dVar13,dVar13,
            dVar14 + -0.5,dVar14 + 0.5,(ulong)uVar6,(ulong)uVar6,"-r");
    if ((this->super_CBoundary).super_CPoint.m_cZ == '\x01') {
      dVar13 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX;
      dVar14 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY + -0.5;
      fprintf((FILE *)pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],\'%s\');\n",dVar13 + -0.5,
              dVar13 + 0.5,dVar14,dVar14,0,0,"-r");
      dVar13 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX + -0.5;
      dVar14 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY;
      fprintf((FILE *)pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],\'%s\');\n",dVar13,dVar13,
              dVar14 + -0.5,dVar14 + 0.5,0,0,"-r");
    }
  }
  else if (iMode == 0x800) {
    pCVar10 = GetParent(this);
    iVar5 = CLayer::IsHorizontal(pCVar10);
    pcVar11 = "H";
    if (iVar5 == 0) {
      pcVar11 = "V";
    }
    sVar2 = (this->super_CBoundary).super_CPoint.m_iX;
    sVar3 = (this->super_CBoundary).super_CPoint.m_iY;
    cVar1 = (this->super_CBoundary).super_CPoint.m_cZ;
    iVar5 = CBoundary::GetCongestion(&this->super_CBoundary);
    fprintf((FILE *)pFile,"%s(%3d,%3d,%3d) %.2f\t",(double)iVar5 / 100.0,pcVar11,
            (ulong)(uint)(int)sVar2,(ulong)(uint)(int)sVar3,(ulong)(uint)(int)cVar1);
  }
  else if (iMode == 0x200) {
    dVar15 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX;
    dVar13 = dVar15 + -0.5;
    dVar16 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY;
    dVar14 = dVar16 + -0.5;
    uVar6 = (uint)(this->super_CBoundary).super_CPoint.m_cZ;
    fprintf((FILE *)pFile,
            "splot \'-\' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n"
            ,dVar13,dVar14,dVar15 + 0.5,dVar14,dVar13,dVar14,dVar13,dVar16 + 0.5,(ulong)uVar6,
            (ulong)uVar6,(ulong)uVar6,(ulong)uVar6);
    if ((this->super_CBoundary).super_CPoint.m_cZ == '\x01') {
      dVar15 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX;
      dVar16 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY;
      dVar13 = dVar15 + -0.5;
      dVar14 = dVar16 + -0.5;
      fprintf((FILE *)pFile,
              "splot \'-\' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n"
              ,dVar13,dVar14,dVar15 + 0.5,dVar14,dVar13,dVar14,dVar13,dVar16 + 0.5,0,0,0,0);
    }
  }
  else if (iMode == 0x400) {
    iVar5 = CBoundary::GetOverFlow(&this->super_CBoundary);
    if (iVar5 != 0) {
      sVar2 = (this->super_CBoundary).super_CPoint.m_iX;
      sVar3 = (this->super_CBoundary).super_CPoint.m_iY;
      cVar1 = (this->super_CBoundary).super_CPoint.m_cZ;
      uVar6 = CBoundary::GetOverFlow(&this->super_CBoundary);
      uVar7 = CBoundary::GetPenalty(&this->super_CBoundary);
      fprintf((FILE *)pFile,"bnd(%d,%d,%d): %d OF -%d\n",(ulong)(uint)(int)sVar2,
              (ulong)(uint)(int)sVar3,(ulong)(uint)(int)cVar1,(ulong)uVar6,(ulong)uVar7);
    }
  }
  else {
    if (iMode != 0x100) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Grid.cpp"
                    ,0x103,"virtual void CGrid::Print(FILE *, int)");
    }
    dVar15 = (double)(int)(this->super_CBoundary).super_CPoint.m_iX;
    dVar13 = dVar15 + -0.5;
    dVar16 = (double)(int)(this->super_CBoundary).super_CPoint.m_iY;
    dVar14 = dVar16 + -0.5;
    fprintf((FILE *)pFile,
            "plot \'-\' w lines lt 1\n %.1f %.1f\n %.1f %.1f\n\n %.1f %.1f\n %.1f %.1f\ne\n",dVar13,
            dVar14,dVar15 + 0.5,dVar14,dVar13,dVar14,dVar13,dVar16 + 0.5);
  }
  fflush((FILE *)pFile);
  return;
}

Assistant:

void CGrid::Print(FILE *pFile, int iMode)
{
	if(pFile==NULL)	return;

	switch(iMode) {
	case PRINT_MODE_GNUPLOT:
		fprintf(pFile,"plot '-' w lines lt 1\n %.1f %.1f\n %.1f %.1f\n\n %.1f %.1f\n %.1f %.1f\ne\n",
			X()-0.5,Y()-0.5,
			X()+0.5,Y()-0.5,
			X()-0.5,Y()-0.5,
			X()-0.5,Y()+0.5);
		break;
	case PRINT_MODE_GNUPLOT3D:
		fprintf(pFile,"splot '-' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n",
			X()-0.5,Y()-0.5,Z(),
			X()+0.5,Y()-0.5,Z(),
			X()-0.5,Y()-0.5,Z(),
			X()-0.5,Y()+0.5,Z());
		if(Z()==1)
		{
			fprintf(pFile,"splot '-' w lines lt 1\n %.1f %.1f %d\n %.1f %.1f %d\n\n %.1f %.1f %d\n %.1f %.1f %d\ne\n",
				X()-0.5,Y()-0.5,0,
				X()+0.5,Y()-0.5,0,
				X()-0.5,Y()-0.5,0,
				X()-0.5,Y()+0.5,0);
		}		
		break;
	case PRINT_MODE_MATLAB:
		fprintf(pFile,"plot([%.1f,%.1f],[%.1f,%.1f],'%s');\n",
			X()-0.5,X()+0.5,
			Y()-0.5,Y()-0.5,
			"-r");
		fprintf(pFile,"plot([%.2f,%.2f],[%.2f,%.2f],'%s');\n",
			X()-0.5,X()-0.5,
			Y()-0.5,Y()+0.5,
			"-r");
		break;
	case PRINT_MODE_MATLAB3D:
		fprintf(pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],'%s');\n",
			X()-0.5,X()+0.5,
			Y()-0.5,Y()-0.5,
			Z(),Z(),
			"-r");
		fprintf(pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],'%s');\n",
			X()-0.5,X()-0.5,
			Y()-0.5,Y()+0.5,
			Z(),Z(),
			"-r");
		if(Z()==1)
		{
			fprintf(pFile,"plot3([%.1f,%.1f],[%.1f,%.1f],[%d,%d],'%s');\n",
				X()-0.5,X()+0.5,
				Y()-0.5,Y()-0.5,
				0,0,
				"-r");
			fprintf(pFile,"plot3([%.2f,%.2f],[%.2f,%.2f],[%d,%d],'%s');\n",
				X()-0.5,X()-0.5,
				Y()-0.5,Y()+0.5,
				0,0,
				"-r");
		}
		break;
	case PRINT_MODE_CGDUMP:
		fprintf(pFile,"%s(%3d,%3d,%3d) %.2f\t",GetParent()->IsHorizontal()? "H":"V",X(),Y(),Z(),GetCongestion()/100.0);
		break;
	//case PRINT_MODE_RESULT:
	//	fprintf(pFile,"b %d %d %d\t%d\n",X(),Y(),Z(),GetNumWire(GET_MODE_SPECIAL));
	//	break;
	case PRINT_MODE_OFDUMP:
		if(GetOverFlow())
		{
			fprintf(pFile,"bnd(%d,%d,%d): %d OF -%d\n",
				X(),Y(),Z(),GetOverFlow(),GetPenalty());
		}
		break;
	case PRINT_MODE_TEXT:
		{
#ifdef _DEBUG
			fprintf(pFile,"grid(%d,%d,%d)\n",X(),Y(),Z());
#else
			fprintf(pFile,"grid(%d,%d,%d) 0x%x\n",X(),Y(),Z(),this);
#endif
			
			fprintf(pFile,"bnd(%d,%d,%d): ocu_cap:%d\tavb_cap:%d\tmax_cap:%d\toverflow:%d\n",
				X(),Y(),Z(),
				GetCapacity(GET_MODE_OCAP),
				GetCapacity(GET_MODE_ACAP),
				GetParent()->GetCapacity(GET_MODE_MAX),
				GetOverFlow());

			for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)	(*itr)->Print(pFile,iMode);
		}
		break;
	default:
		assert(FALSE);
		break;
	}
	fflush(pFile);
}